

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

void llb_build_key_get_filtered_directory_filters
               (llb_build_key_t *key,void *context,IteratorFunction iterator)

{
  bool bVar1;
  reference pSVar2;
  char *__s;
  string local_a8;
  undefined1 local_88 [8];
  llb_data_t data;
  StringRef filter;
  iterator __end1;
  iterator __begin1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range1;
  StringList filters;
  IteratorFunction iterator_local;
  void *context_local;
  llb_build_key_t *key_local;
  
  filters.size = (uint64_t)iterator;
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::getInternalBuildKey((CAPIBuildKey *)key);
  llbuild::buildsystem::BuildKey::getContentExclusionPatternsAsStringList((BuildKey *)&__range1);
  llbuild::basic::StringList::getValues
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin1,
             (StringList *)&__range1);
  __end1 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                     ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin1);
  filter.Length =
       (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                         ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                *)&filter.Length);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
             ::operator*(&__end1);
    data.data = (uint8_t *)pSVar2->Data;
    local_88 = (undefined1  [8])pSVar2->Length;
    filter.Data = (char *)local_88;
    llvm::StringRef::str_abi_cxx11_(&local_a8,(StringRef *)&data.data);
    __s = (char *)std::__cxx11::string::c_str();
    data.length = (uint64_t)strdup(__s);
    std::__cxx11::string::~string((string *)&local_a8);
    (*(code *)filters.size)(context,local_88,data.length);
    llb_data_destroy((llb_data_t *)local_88);
    __gnu_cxx::
    __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
    ::operator++(&__end1);
  }
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin1);
  llbuild::basic::StringList::~StringList((StringList *)&__range1);
  return;
}

Assistant:

void llb_build_key_get_filtered_directory_filters(llb_build_key_t *key, void *context, IteratorFunction iterator) {
  auto filters = ((CAPIBuildKey *)key)->getInternalBuildKey().getContentExclusionPatternsAsStringList();
  for (auto filter: filters.getValues()) {
    llb_data_t data;
    data.length = filter.size();
    data.data = (const uint8_t*)strdup(filter.str().c_str());
    iterator(context, data);
    llb_data_destroy(&data);
  }
}